

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrPrint.c
# Opt level: O0

void Rwr_NodePrint(FILE *pFile,Rwr_Man_t *p,Rwr_Node_t *pNode)

{
  uint local_24;
  Rwr_Node_t *pRStack_20;
  uint uTruth;
  Rwr_Node_t *pNode_local;
  Rwr_Man_t *p_local;
  FILE *pFile_local;
  
  pRStack_20 = pNode;
  pNode_local = (Rwr_Node_t *)p;
  p_local = (Rwr_Man_t *)pFile;
  fprintf((FILE *)pFile,"%5d : ",(ulong)(uint)pNode->Id);
  local_24 = *(uint *)&pRStack_20->field_0xe & 0xffff;
  Extra_PrintHex((FILE *)p_local,&local_24,4);
  fprintf((FILE *)p_local," tt=");
  Extra_PrintBinary((FILE *)p_local,&local_24,0x10);
  fprintf((FILE *)p_local," lev=%d",(ulong)(*(uint *)&pRStack_20->field_0xe >> 0x18 & 0x3f));
  fprintf((FILE *)p_local," vol=%d",(ulong)(*(uint *)&pRStack_20->field_0xe >> 0x10 & 0xff));
  fprintf((FILE *)p_local,"  ");
  Rwr_NodePrint_rec((FILE *)p_local,pRStack_20);
  fprintf((FILE *)p_local,"\n");
  return;
}

Assistant:

void Rwr_NodePrint( FILE * pFile, Rwr_Man_t * p, Rwr_Node_t * pNode )
{
    unsigned uTruth;
    fprintf( pFile, "%5d : ", pNode->Id );
    uTruth = pNode->uTruth;
    Extra_PrintHex( pFile, &uTruth, 4 );
    fprintf( pFile, " tt=" );
    Extra_PrintBinary( pFile, &uTruth, 16 );
//    fprintf( pFile, " cn=", pNode->Id );
//    uTruth = p->puCanons[pNode->uTruth];
//    Extra_PrintBinary( pFile, &uTruth, 16 );
    fprintf( pFile, " lev=%d", pNode->Level );
    fprintf( pFile, " vol=%d", pNode->Volume );
    fprintf( pFile, "  " );
    Rwr_NodePrint_rec( pFile, pNode );
    fprintf( pFile, "\n" );
}